

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

int BuildMapBitdepth16To8(TIFFRGBAImage *img)

{
  uint8_t *puVar1;
  int iVar2;
  long lVar3;
  
  if (img->Bitdepth16To8 == (uint8_t *)0x0) {
    puVar1 = (uint8_t *)_TIFFmallocExt(img->tif,0x10000);
    img->Bitdepth16To8 = puVar1;
    if (puVar1 == (uint8_t *)0x0) {
      iVar2 = 0;
      TIFFErrorExtR(img->tif,"BuildMapBitdepth16To8","Out of memory");
    }
    else {
      iVar2 = 1;
      for (lVar3 = 0; (int)lVar3 != 0x10000; lVar3 = lVar3 + 1) {
        puVar1[lVar3] = (uint8_t)((ulong)((int)lVar3 + 0x80) / 0x101);
      }
    }
    return iVar2;
  }
  __assert_fail("img->Bitdepth16To8 == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_getimage.c"
                ,0xc65,"int BuildMapBitdepth16To8(TIFFRGBAImage *)");
}

Assistant:

static int BuildMapBitdepth16To8(TIFFRGBAImage *img)
{
    static const char module[] = "BuildMapBitdepth16To8";
    uint8_t *m;
    uint32_t n;
    assert(img->Bitdepth16To8 == NULL);
    img->Bitdepth16To8 = _TIFFmallocExt(img->tif, 65536);
    if (img->Bitdepth16To8 == NULL)
    {
        TIFFErrorExtR(img->tif, module, "Out of memory");
        return (0);
    }
    m = img->Bitdepth16To8;
    for (n = 0; n < 65536; n++)
        *m++ = (uint8_t)((n + 128) / 257);
    return (1);
}